

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ThreadedSectionInfo::~ThreadedSectionInfo(ThreadedSectionInfo *this)

{
  (this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__ThreadedSectionInfo_00162380;
  std::
  vector<Catch::Ptr<Catch::ThreadedSectionInfo>,_std::allocator<Catch::Ptr<Catch::ThreadedSectionInfo>_>_>
  ::~vector(&this->children);
  IReporter::~IReporter((IReporter *)this);
  SectionInfo::~SectionInfo(&this->super_SectionInfo);
  return;
}

Assistant:

ThreadedSectionInfo::~ThreadedSectionInfo() {}